

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int read_Times(archive_read *a,_7z_header_info *h,int type)

{
  long lVar1;
  uint *puVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  uchar *data;
  uchar *puVar8;
  uint64_t *puVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  
  pvVar4 = a->format->data;
  lVar5 = *(long *)((long)pvVar4 + 0xa0);
  data = (uchar *)calloc(*(size_t *)((long)pvVar4 + 0x98),1);
  if (data == (uchar *)0x0) {
    return -1;
  }
  puVar8 = header_bytes(a,1);
  iVar10 = -1;
  if (puVar8 != (uchar *)0x0) {
    if (*puVar8 == '\0') {
      iVar7 = read_Bools(a,data,*(size_t *)((long)pvVar4 + 0x98));
      if (iVar7 < 0) goto LAB_0017323d;
    }
    else {
      memset(data,1,*(size_t *)((long)pvVar4 + 0x98));
    }
    puVar8 = header_bytes(a,1);
    if ((puVar8 != (uchar *)0x0) &&
       ((*puVar8 == '\0' ||
        ((iVar7 = parse_7zip_uint64(a,&h->dataIndex), -1 < iVar7 && (h->dataIndex < 0x5f5e101))))))
    {
      if (*(long *)((long)pvVar4 + 0x98) != 0) {
        uVar11 = 0;
        uVar12 = 1;
        do {
          if (data[uVar11] != '\0') {
            puVar9 = (uint64_t *)header_bytes(a,8);
            if (puVar9 == (uint64_t *)0x0) {
              iVar10 = -1;
              goto LAB_0017323d;
            }
            if (type - 0x12U < 3) {
              uVar3 = *(uint *)(&DAT_0018a2c0 + (ulong)(type - 0x12U) * 4);
              lVar1 = lVar5 + uVar11 * 0x50;
              ntfs_to_unix(*puVar9,(int64_t *)(lVar1 + (ulong)(0x30 - (type * 8 + -0x90))),
                           (uint32_t *)(lVar1 + (ulong)(0x40 - (type * 4 + -0x48))));
              puVar2 = (uint *)(lVar5 + 0x18 + uVar11 * 0x50);
              *puVar2 = *puVar2 | uVar3;
            }
          }
          bVar6 = uVar12 < *(ulong *)((long)pvVar4 + 0x98);
          uVar11 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar6);
      }
      iVar10 = 0;
    }
  }
LAB_0017323d:
  free(data);
  return iVar10;
}

Assistant:

static int
read_Times(struct archive_read *a, struct _7z_header_info *h, int type)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7zip_entry *entries = zip->entries;
	unsigned char *timeBools;
	int allAreDefined;
	unsigned i;

	timeBools = calloc((size_t)zip->numFiles, sizeof(*timeBools));
	if (timeBools == NULL)
		return (-1);

	/* Read allAreDefined. */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	allAreDefined = *p;
	if (allAreDefined)
		memset(timeBools, 1, (size_t)zip->numFiles);
	else {
		if (read_Bools(a, timeBools, (size_t)zip->numFiles) < 0)
			goto failed;
	}

	/* Read external. */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	if (*p) {
		if (parse_7zip_uint64(a, &(h->dataIndex)) < 0)
			goto failed;
		if (UMAX_ENTRY < h->dataIndex)
			goto failed;
	}

	for (i = 0; i < zip->numFiles; i++) {
		if (!timeBools[i])
			continue;
		if ((p = header_bytes(a, 8)) == NULL)
			goto failed;
		switch (type) {
		case kCTime:
			ntfs_to_unix(archive_le64dec(p),
			    &(entries[i].ctime),
			    &(entries[i].ctime_ns));
			entries[i].flg |= CTIME_IS_SET;
			break;
		case kATime:
			ntfs_to_unix(archive_le64dec(p),
			    &(entries[i].atime),
			    &(entries[i].atime_ns));
			entries[i].flg |= ATIME_IS_SET;
			break;
		case kMTime:
			ntfs_to_unix(archive_le64dec(p),
			    &(entries[i].mtime),
			    &(entries[i].mtime_ns));
			entries[i].flg |= MTIME_IS_SET;
			break;
		}
	}

	free(timeBools);
	return (0);
failed:
	free(timeBools);
	return (-1);
}